

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# track.c
# Opt level: O0

void save_track(memfile *mf)

{
  int local_14;
  int i;
  memfile *mf_local;
  
  mtag(mf,0,MTAG_TRACK);
  for (local_14 = 0; local_14 < 0x32; local_14 = local_14 + 1) {
    mwrite8(mf,utrack[local_14].x);
    mwrite8(mf,utrack[local_14].y);
  }
  mwrite32(mf,utcnt);
  mwrite32(mf,utpnt);
  return;
}

Assistant:

void save_track(struct memfile *mf)
{
    int i;
    mtag(mf, 0, MTAG_TRACK);
    for (i = 0; i < UTSZ; i++) {
	mwrite8(mf, utrack[i].x);
	mwrite8(mf, utrack[i].y);
    }
    mwrite32(mf, utcnt);
    mwrite32(mf, utpnt);
}